

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quantize.cpp
# Opt level: O0

void nv::Quantize::BinaryAlpha(Image *image,int alpha_threshold)

{
  int iVar1;
  uint uVar2;
  anon_union_4_2_12391d8d_for_Color32_0 aVar3;
  Color32 *c;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar4;
  anon_union_4_2_12391d8d_for_Color32_0 local_28;
  uint local_24;
  Color32 pixel;
  uint x;
  uint y;
  uint h;
  uint w;
  int alpha_threshold_local;
  Image *image_local;
  
  if ((image == (Image *)0x0) &&
     (iVar1 = nvAbort("image != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/Quantize.cpp"
                      ,0x1e,"void nv::Quantize::BinaryAlpha(Image *, int)"), iVar1 == 1)) {
    raise(5);
  }
  uVar2 = Image::width(image);
  aVar3.u = Image::height(image);
  for (pixel.field_0 =
            (anon_union_4_2_12391d8d_for_Color32_0)
            (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0)0x0;
      (uint)pixel.field_0 < aVar3.u;
      pixel.field_0 = (anon_union_4_2_12391d8d_for_Color32_0)((int)pixel.field_0 + 1)) {
    for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
      c = Image::pixel(image,local_24,(uint)pixel.field_0);
      Color32::Color32((Color32 *)&local_28.field_0,c);
      if (alpha_threshold < (int)(local_28.u >> 0x18)) {
        local_28.field_0.a = 0xff;
      }
      else {
        local_28.u = local_28.u & 0xffffff;
      }
      paVar4 = &Image::pixel(image,local_24,(uint)pixel.field_0)->field_0;
      *paVar4 = local_28;
    }
  }
  return;
}

Assistant:

void nv::Quantize::BinaryAlpha( Image * image, int alpha_threshold /*= 127*/ )
{
	nvCheck(image != NULL);
	
	const uint w = image->width();
	const uint h = image->height();
	
	for(uint y = 0; y < h; y++) {
		for(uint x = 0; x < w; x++) {
			
			Color32 pixel = image->pixel(x, y);
			
			// Convert color.
			if( pixel.a > alpha_threshold ) pixel.a = 255;
			else pixel.a = 0;
			
			// Store color.
			image->pixel(x, y) = pixel;
		}
	}
}